

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_server_close(http_server_t *server)

{
  int __fd;
  uint uVar1;
  http_client_t *__ptr;
  long lVar2;
  ulong uVar3;
  
  if (server != (http_server_t *)0x0) {
    __ptr = server->clients;
    if (__ptr != (http_client_t *)0x0) {
      uVar1 = server->num_clients;
      if (uVar1 != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          __fd = *(int *)(server->clients->buf + lVar2 + -0x10);
          if (__fd != -1) {
            close(__fd);
            uVar1 = server->num_clients;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x2018;
        } while (uVar3 < uVar1);
        __ptr = server->clients;
      }
      free(__ptr);
    }
    server->clients = (http_client_t *)0x0;
    server->num_clients = 0;
    server->count_clients = 0;
    server->max_clients = 0;
    if (server->fd != -1) {
      close(server->fd);
    }
    server->fd = -1;
    server->callback = (http_client_callback_t *)0x0;
    return;
  }
  __assert_fail("server != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x48,
                "void http_server_close(http_server_t *)");
}

Assistant:

void http_server_close(http_server_t *server) {
  assert(server != NULL);

  if (server->clients != NULL) {
    unsigned int i;
    for (i = 0; i < server->num_clients; i++) {
      if (server->clients[i].fd != -1) {
        close(server->clients[i].fd);
      }
    }
    free(server->clients);
  }
  server->clients       = NULL;
  server->num_clients   = 0;
  server->count_clients = 0;
  server->max_clients   = 0;
  
  if (server->fd != -1)
    close(server->fd);
  server->fd = -1;

  server->callback = NULL;
}